

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# homomorphism_searcher.cc
# Opt level: O0

void __thiscall
gss::innards::HomomorphismSearcher::post_nogood
          (HomomorphismSearcher *this,HomomorphismAssignments *assignments)

{
  bool bVar1;
  const_iterator this_00;
  const_iterator assignments_00;
  reference pHVar2;
  HomomorphismAssignment *in_RDI;
  HomomorphismAssignmentInformation *a;
  const_iterator __end1;
  const_iterator __begin1;
  vector<gss::innards::HomomorphismAssignmentInformation,_std::allocator<gss::innards::HomomorphismAssignmentInformation>_>
  *__range1;
  Nogood<gss::innards::HomomorphismAssignment> nogood;
  vector<gss::innards::HomomorphismAssignmentInformation,_std::allocator<gss::innards::HomomorphismAssignmentInformation>_>
  *in_stack_ffffffffffffff78;
  __normal_iterator<const_gss::innards::HomomorphismAssignmentInformation_*,_std::vector<gss::innards::HomomorphismAssignmentInformation,_std::allocator<gss::innards::HomomorphismAssignmentInformation>_>_>
  *in_stack_ffffffffffffff80;
  vector<gss::innards::HomomorphismAssignment,_std::allocator<gss::innards::HomomorphismAssignment>_>
  *in_stack_ffffffffffffff90;
  Nogood<gss::innards::HomomorphismAssignment> *in_stack_ffffffffffffff98;
  Watches<gss::innards::HomomorphismAssignment,_gss::innards::HomomorphismAssignmentWatchTable>
  *in_stack_ffffffffffffffa0;
  vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_> *in_stack_ffffffffffffffd8;
  Proof *in_stack_ffffffffffffffe0;
  
  bVar1 = might_have_watches((HomomorphismParams *)0x16bd0a);
  if (bVar1) {
    Nogood<gss::innards::HomomorphismAssignment>::Nogood
              ((Nogood<gss::innards::HomomorphismAssignment> *)0x16bd1d);
    this_00 = std::
              vector<gss::innards::HomomorphismAssignmentInformation,_std::allocator<gss::innards::HomomorphismAssignmentInformation>_>
              ::begin(in_stack_ffffffffffffff78);
    assignments_00 =
         std::
         vector<gss::innards::HomomorphismAssignmentInformation,_std::allocator<gss::innards::HomomorphismAssignmentInformation>_>
         ::end(in_stack_ffffffffffffff78);
    while (bVar1 = __gnu_cxx::
                   operator==<const_gss::innards::HomomorphismAssignmentInformation_*,_std::vector<gss::innards::HomomorphismAssignmentInformation,_std::allocator<gss::innards::HomomorphismAssignmentInformation>_>_>
                             (in_stack_ffffffffffffff80,
                              (__normal_iterator<const_gss::innards::HomomorphismAssignmentInformation_*,_std::vector<gss::innards::HomomorphismAssignmentInformation,_std::allocator<gss::innards::HomomorphismAssignmentInformation>_>_>
                               *)in_stack_ffffffffffffff78), ((bVar1 ^ 0xffU) & 1) != 0) {
      pHVar2 = __gnu_cxx::
               __normal_iterator<const_gss::innards::HomomorphismAssignmentInformation_*,_std::vector<gss::innards::HomomorphismAssignmentInformation,_std::allocator<gss::innards::HomomorphismAssignmentInformation>_>_>
               ::operator*((__normal_iterator<const_gss::innards::HomomorphismAssignmentInformation_*,_std::vector<gss::innards::HomomorphismAssignmentInformation,_std::allocator<gss::innards::HomomorphismAssignmentInformation>_>_>
                            *)&stack0xffffffffffffffc8);
      if ((pHVar2->is_decision & 1U) != 0) {
        std::
        vector<gss::innards::HomomorphismAssignment,std::allocator<gss::innards::HomomorphismAssignment>>
        ::emplace_back<gss::innards::HomomorphismAssignment_const&>
                  (in_stack_ffffffffffffff90,in_RDI);
      }
      __gnu_cxx::
      __normal_iterator<const_gss::innards::HomomorphismAssignmentInformation_*,_std::vector<gss::innards::HomomorphismAssignmentInformation,_std::allocator<gss::innards::HomomorphismAssignmentInformation>_>_>
      ::operator++((__normal_iterator<const_gss::innards::HomomorphismAssignmentInformation_*,_std::vector<gss::innards::HomomorphismAssignmentInformation,_std::allocator<gss::innards::HomomorphismAssignmentInformation>_>_>
                    *)&stack0xffffffffffffffc8);
    }
    Watches<gss::innards::HomomorphismAssignment,_gss::innards::HomomorphismAssignmentWatchTable>::
    post_nogood(in_stack_ffffffffffffffa0,in_stack_ffffffffffffff98);
    bVar1 = std::__shared_ptr::operator_cast_to_bool((__shared_ptr *)(in_RDI + 6));
    if (bVar1) {
      std::__shared_ptr_access<gss::innards::Proof,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
      operator->((__shared_ptr_access<gss::innards::Proof,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                  *)0x16bde4);
      assignments_as_proof_decisions
                ((HomomorphismSearcher *)this_00._M_current,
                 (HomomorphismAssignments *)assignments_00._M_current);
      Proof::post_restart_nogood(in_stack_ffffffffffffffe0,in_stack_ffffffffffffffd8);
      std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>::~vector
                ((vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_> *)
                 in_stack_ffffffffffffff90);
    }
    Nogood<gss::innards::HomomorphismAssignment>::~Nogood
              ((Nogood<gss::innards::HomomorphismAssignment> *)0x16be40);
  }
  return;
}

Assistant:

auto HomomorphismSearcher::post_nogood(const HomomorphismAssignments & assignments) -> void
{
    if (! might_have_watches(params))
        return;

    Nogood<HomomorphismAssignment> nogood;

    for (auto & a : assignments.values)
        if (a.is_decision)
            nogood.literals.emplace_back(a.assignment);

    watches.post_nogood(move(nogood));

    if (proof)
        proof->post_restart_nogood(assignments_as_proof_decisions(assignments));
}